

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O0

void ecs_table_delete_column
               (ecs_world_t *world,ecs_table_t *table,int32_t column,ecs_vector_t *vector)

{
  short offset;
  ecs_c_info_t *peVar1;
  ecs_xtor_t p_Var2;
  ecs_entity_t eVar3;
  int32_t iVar4;
  ecs_column_t *peVar5;
  ecs_entity_t *peVar6;
  void *pvVar7;
  size_t sVar8;
  void *ptr;
  int32_t count;
  int16_t alignment;
  ecs_entity_t *entities;
  ecs_xtor_t dtor;
  ecs_c_info_t *c_info;
  ecs_column_t *c;
  ecs_vector_t *vector_local;
  int32_t column_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  c = (ecs_column_t *)vector;
  if (vector == (ecs_vector_t *)0x0) {
    c = (ecs_column_t *)ecs_table_get_column(table,column);
    if ((ecs_vector_t *)c == (ecs_vector_t *)0x0) {
      return;
    }
    _ecs_assert(table->data != (ecs_data_t *)0x0,0xc,(char *)0x0,"table->data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0xe4);
    if (table->data == (ecs_data_t *)0x0) {
      __assert_fail("table->data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                    ,0xe4,
                    "void ecs_table_delete_column(ecs_world_t *, ecs_table_t *, int32_t, ecs_vector_t *)"
                   );
    }
    _ecs_assert(table->data->columns != (ecs_column_t *)0x0,0xc,(char *)0x0,
                "table->data->columns != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0xe5);
    if (table->data->columns == (ecs_column_t *)0x0) {
      __assert_fail("table->data->columns != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                    ,0xe5,
                    "void ecs_table_delete_column(ecs_world_t *, ecs_table_t *, int32_t, ecs_vector_t *)"
                   );
    }
    table->data->columns[column].data = (ecs_vector_t *)0x0;
  }
  peVar5 = da_get_or_create_column(world,table,column);
  ecs_vector_assert_size((ecs_vector_t *)c,(int)peVar5->size);
  peVar1 = table->c_info[column];
  if ((peVar1 != (ecs_c_info_t *)0x0) &&
     (p_Var2 = (peVar1->lifecycle).dtor, p_Var2 != (ecs_xtor_t)0x0)) {
    peVar6 = get_entity_array(table,0);
    offset = peVar5->alignment;
    iVar4 = ecs_vector_count((ecs_vector_t *)c);
    if (offset < 0x10) {
      offset = 0x10;
    }
    pvVar7 = _ecs_vector_first((ecs_vector_t *)c,(int)peVar5->size,offset);
    eVar3 = peVar1->component;
    sVar8 = ecs_to_size_t((long)peVar5->size);
    (*p_Var2)(world,eVar3,peVar6,pvVar7,sVar8,iVar4,(peVar1->lifecycle).ctx);
  }
  if (peVar5->data == (ecs_vector_t *)c) {
    peVar5->data = (ecs_vector_t *)0x0;
  }
  ecs_vector_free((ecs_vector_t *)c);
  return;
}

Assistant:

void ecs_table_delete_column(
    ecs_world_t *world,
    ecs_table_t *table,
    int32_t column,
    ecs_vector_t *vector)
{
    if (!vector) {
        vector = ecs_table_get_column(table, column);
        if (!vector) {
            return;
        }

        ecs_assert(table->data != NULL, ECS_INTERNAL_ERROR, NULL);
        ecs_assert(table->data->columns != NULL, ECS_INTERNAL_ERROR, NULL);

        table->data->columns[column].data = NULL;
    }

    ecs_column_t *c = da_get_or_create_column(world, table, column);
    ecs_vector_assert_size(vector, c->size);

    ecs_c_info_t *c_info = table->c_info[column];
    ecs_xtor_t dtor;
    if (c_info && (dtor = c_info->lifecycle.dtor)) {
        ecs_entity_t *entities = get_entity_array(table, 0);
        int16_t alignment = c->alignment;
        int32_t count = ecs_vector_count(vector);
        void *ptr = ecs_vector_first_t(vector, c->size, alignment);
        dtor(world, c_info->component, entities, ptr, ecs_to_size_t(c->size), 
            count, c_info->lifecycle.ctx);
    }

    if (c->data == vector) {
        c->data = NULL;
    }

    ecs_vector_free(vector);
}